

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprIsTableConstraint(Expr *pExpr,SrcItem *pSrc)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = (pSrc->fg).jointype;
  if ((bVar1 & 0x40) != 0) {
    return 0;
  }
  if ((bVar1 & 8) == 0) {
    if ((pExpr->flags & 1) != 0) {
      return 0;
    }
    iVar2 = pSrc->iCursor;
  }
  else {
    if ((pExpr->flags & 1) == 0) {
      return 0;
    }
    iVar2 = (pExpr->w).iJoin;
    if (iVar2 != pSrc->iCursor) {
      return 0;
    }
  }
  iVar2 = exprIsConst(pExpr,3,iVar2);
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsTableConstraint(Expr *pExpr, const SrcItem *pSrc){
  if( pSrc->fg.jointype & JT_LTORJ ){
    return 0;  /* rule (3) */
  }
  if( pSrc->fg.jointype & JT_LEFT ){
    if( !ExprHasProperty(pExpr, EP_OuterON) ) return 0;   /* rule (4a) */
    if( pExpr->w.iJoin!=pSrc->iCursor ) return 0;         /* rule (4b) */
  }else{
    if( ExprHasProperty(pExpr, EP_OuterON) ) return 0;    /* rule (5) */
  }
  return sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor); /* rules (1), (2) */
}